

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O3

bool __thiscall
pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::operator==(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             *this,maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                   *other)

{
  size_t __n;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  
  bVar4 = this->valid_ == other->valid_;
  if ((this->valid_ & bVar4) == 1) {
    pbVar2 = maybe<std::__cxx11::string,void>::
             value_impl<pstore::maybe<std::__cxx11::string,void>const&,std::__cxx11::string_const>
                       (this);
    pbVar3 = maybe<std::__cxx11::string,void>::
             value_impl<pstore::maybe<std::__cxx11::string,void>const&,std::__cxx11::string_const>
                       (other);
    __n = pbVar2->_M_string_length;
    if (__n == pbVar3->_M_string_length) {
      if (__n == 0) {
        bVar4 = true;
      }
      else {
        iVar1 = bcmp((pbVar2->_M_dataplus)._M_p,(pbVar3->_M_dataplus)._M_p,__n);
        bVar4 = iVar1 == 0;
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

constexpr bool has_value () const noexcept { return valid_; }